

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::calculateHSharedObject(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  int iVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  pointer pHVar3;
  long lVar4;
  vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_> *this_00;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *this_01;
  Members *pMVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  unsigned_long uVar9;
  reference pvVar10;
  Object *pOVar11;
  NewObject *this_02;
  qpdf_offset_t qVar12;
  size_t i;
  ulong uVar13;
  int iVar14;
  allocator<char> local_79;
  QPDF *local_78;
  ObjTable *local_70;
  ObjTable<QPDFWriter::NewObject> *local_68;
  int *local_60;
  Members *local_58;
  string local_50;
  
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  this_00 = (vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_> *)
            ((long)&(_Var2._M_head_impl)->c_shared_object_data + 0x10);
  pHVar3 = *(pointer *)
            &((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ((long)&(_Var2._M_head_impl)->shared_object_hints + 0x28))->
             super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
  ;
  if (*(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30) != pHVar3) {
    *(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30) = pHVar3;
  }
  this_01 = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
            ((long)&(_Var2._M_head_impl)->shared_object_hints + 0x28);
  uVar13 = 0;
  local_78 = this;
  local_70 = obj;
  local_68 = &new_obj->super_ObjTable<QPDFWriter::NewObject>;
  pvVar8 = std::vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>::at
                     (this_00,0);
  iVar6 = outputLengthNextN(local_78,pvVar8->object,1,(NewObjTable *)local_68,local_70);
  local_60 = (int *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 8);
  iVar14 = iVar6;
  local_58 = _Var2._M_head_impl;
  while( true ) {
    uVar9 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(local_60);
    if (uVar9 <= uVar13) break;
    pvVar8 = std::vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>::at
                       (this_00,uVar13);
    iVar7 = outputLengthNextN(local_78,pvVar8->object,1,(NewObjTable *)local_68,local_70);
    if (iVar7 < iVar14) {
      iVar14 = iVar7;
    }
    if (iVar6 <= iVar7) {
      iVar6 = iVar7;
    }
    std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::emplace_back<>
              (this_01);
    pvVar10 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                        (this_01,uVar13);
    pvVar10->delta_group_length = iVar7;
    uVar13 = uVar13 + 1;
  }
  pHVar3 = *(pointer *)
            ((long)&(local_58->shared_object_hints).entries.
                    super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
            + 8);
  lVar4 = *(long *)&(local_58->shared_object_hints).entries.
                    super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                    ._M_impl.super__Vector_impl_data;
  uVar9 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(local_60);
  if (((long)pHVar3 - lVar4) / 0xc != uVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"soe has wrong size after initialization",&local_79);
    stopOnError(local_78,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pMVar5 = local_58;
  iVar7 = (local_58->c_shared_object_data).nshared_first_page;
  iVar1 = (local_58->c_shared_object_data).nshared_total;
  (local_58->shared_object_hints).nshared_total = iVar1;
  (local_58->shared_object_hints).nshared_first_page = iVar7;
  if (iVar7 < iVar1) {
    pOVar11 = ObjTable<QPDFWriter::Object>::operator[]
                        (&local_70->super_ObjTable<QPDFWriter::Object>,
                         (local_58->c_shared_object_data).first_shared_obj);
    iVar7 = pOVar11->renumber;
    (pMVar5->shared_object_hints).first_shared_obj = iVar7;
    (pMVar5->shared_object_hints).min_group_length = iVar14;
    this_02 = ObjTable<QPDFWriter::NewObject>::operator[](local_68,iVar7);
    qVar12 = QPDFXRefEntry::getOffset(&this_02->xref);
    (pMVar5->shared_object_hints).first_shared_offset = qVar12;
  }
  (pMVar5->shared_object_hints).min_group_length = iVar14;
  iVar6 = nbits(iVar6 - iVar14);
  (pMVar5->shared_object_hints).nbits_delta_group_length = iVar6;
  uVar13 = 0;
  while( true ) {
    uVar9 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(local_60);
    if (uVar9 <= uVar13) break;
    pvVar10 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                        (this_01,uVar13);
    if (pvVar10->delta_group_length < iVar14) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"found too small group length while writing linearization data"
                 ,&local_79);
      stopOnError(local_78,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    pvVar10 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                        (this_01,uVar13);
    pvVar10->delta_group_length = pvVar10->delta_group_length - iVar14;
    uVar13 = uVar13 + 1;
  }
  return;
}

Assistant:

void
QPDF::calculateHSharedObject(
    QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    CHSharedObject& cso = m->c_shared_object_data;
    std::vector<CHSharedObjectEntry>& csoe = cso.entries;
    HSharedObject& so = m->shared_object_hints;
    std::vector<HSharedObjectEntry>& soe = so.entries;
    soe.clear();

    int min_length = outputLengthNextN(csoe.at(0).object, 1, new_obj, obj);
    int max_length = min_length;

    for (size_t i = 0; i < toS(cso.nshared_total); ++i) {
        // Assign absolute numbers to deltas; adjust later
        int length = outputLengthNextN(csoe.at(i).object, 1, new_obj, obj);
        min_length = std::min(min_length, length);
        max_length = std::max(max_length, length);
        soe.emplace_back();
        soe.at(i).delta_group_length = length;
    }
    if (soe.size() != toS(cso.nshared_total)) {
        stopOnError("soe has wrong size after initialization");
    }

    so.nshared_total = cso.nshared_total;
    so.nshared_first_page = cso.nshared_first_page;
    if (so.nshared_total > so.nshared_first_page) {
        so.first_shared_obj = obj[cso.first_shared_obj].renumber;
        so.min_group_length = min_length;
        so.first_shared_offset = new_obj[so.first_shared_obj].xref.getOffset();
    }
    so.min_group_length = min_length;
    so.nbits_delta_group_length = nbits(max_length - min_length);

    for (size_t i = 0; i < toS(cso.nshared_total); ++i) {
        // Adjust deltas
        if (soe.at(i).delta_group_length < min_length) {
            stopOnError("found too small group length while writing linearization data");
        }
        soe.at(i).delta_group_length -= min_length;
    }
}